

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

void __thiscall Zippy::ZipArchive::ZipArchive(ZipArchive *this,string *fileName)

{
  undefined1 auVar1 [64];
  byte bVar2;
  char *pcVar3;
  undefined8 *in_RDI;
  ifstream f;
  string *in_stack_00000858;
  ZipArchive *in_stack_00000860;
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe88;
  ZipArchive *in_stack_fffffffffffffe90;
  
  *in_RDI = &PTR__ZipArchive_00231d10;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(in_RDI + 7) = auVar1;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(in_RDI + 1) = auVar1;
  std::__cxx11::string::string(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  *(undefined1 *)(in_RDI + 0x13) = 0;
  *(undefined1 (*) [16])(in_RDI + 0x14) = (undefined1  [16])0x0;
  in_RDI[0x16] = 0;
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::vector
            ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)0x11ad36);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11ad43)
  ;
  std::ifstream::ifstream(local_218,pcVar3,_S_in);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    std::ifstream::close();
    Create(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    std::ifstream::close();
    Open(in_stack_00000860,in_stack_00000858);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

explicit ZipArchive(const std::string& fileName)
                : m_ArchivePath(fileName) {

            // ===== Open file stream
            std::ifstream f(fileName.c_str());

            // ===== If successful, continue to open the file.
            if (f.good()) {
                f.close();
                Open(fileName);
            }

            // ===== If unsuccessful, create the archive file and continue.
            else {
                f.close();
                Create(fileName);
            }

        }